

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::VariantSelectPrimSpec
               (PrimSpec *dst,PrimSpec *src,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variant_selection,string *warn,string *err)

{
  string *__rhs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  *this;
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  __type _Var5;
  value_type *pvVar6;
  size_type sVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  mapped_type *this_00;
  _Base_ptr p_Var12;
  ostream *poVar13;
  long lVar14;
  PrimSpec *extraout_RDX;
  PrimSpec *pPVar15;
  PrimSpec *extraout_RDX_00;
  long lVar16;
  long lVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *err_00;
  PrimSpec *child;
  pointer __x;
  key_type *__x_00;
  long lVar18;
  PrimSpec *pPVar19;
  string variantName;
  PrimSpec ps;
  
  bVar4 = (src->_metas).variantSets.has_value_;
  if ((src->_metas).variants.has_value_ == true) {
    if (bVar4 != false) {
      err_00 = err;
      pvVar6 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::value(&(src->_metas).variantSets);
      PrimSpec::operator=(dst,src);
      PrimSpec::PrimSpec(&ps,src);
      lVar14 = (long)(pvVar6->second).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar6->second).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      this = &dst->_variantSets;
      pPVar15 = extraout_RDX;
      do {
        if (lVar14 < 1) {
          ps._specifier = Over;
          bVar4 = OverridePrimSpec((tinyusdz *)dst,&ps,pPVar15,err,err_00);
          if (bVar4) {
            nonstd::optional_lite::
            optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::reset(&(dst->_metas).variants);
            nonstd::optional_lite::
            optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::reset(&(dst->_metas).variantSets);
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
            ::clear(&this->_M_t);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variantName);
            poVar13 = ::std::operator<<((ostream *)&variantName,"[error]");
            poVar13 = ::std::operator<<(poVar13,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                       );
            poVar13 = ::std::operator<<(poVar13,":");
            poVar13 = ::std::operator<<(poVar13,"VariantSelectPrimSpec");
            poVar13 = ::std::operator<<(poVar13,"():");
            poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6ad);
            ::std::operator<<(poVar13," ");
            poVar13 = ::std::operator<<((ostream *)&variantName,"Failed to override PrimSpec.");
            ::std::operator<<(poVar13,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variantName);
          }
          PrimSpec::~PrimSpec(&ps);
          return bVar4;
        }
        lVar14 = lVar14 + -1;
        __x_00 = (pvVar6->second).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar14;
        variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
        variantName._M_string_length = 0;
        variantName.field_2._M_local_buf[0] = '\0';
        sVar7 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(variant_selection,__x_00);
        if (sVar7 == 0) {
          bVar4 = PrimSpec::current_variant_selection(dst,__x_00,&variantName);
          if (bVar4) goto LAB_00177da1;
        }
        else {
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(variant_selection,__x_00);
          ::std::__cxx11::string::_M_assign((string *)&variantName);
LAB_00177da1:
          sVar8 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                  ::count(this,__x_00);
          if (sVar8 != 0) {
            pmVar9 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                     ::at(this,__x_00);
            sVar10 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                     ::count(&pmVar9->variantSet,&variantName);
            if (sVar10 != 0) {
              pmVar11 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                        ::at(&pmVar9->variantSet,&variantName);
              PrimMetas::update_from(&ps._metas,&pmVar11->_metas,true);
              for (p_Var12 = (pmVar11->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var12 !=
                  &(pmVar11->_props)._M_t._M_impl.super__Rb_tree_header;
                  p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12)) {
                this_00 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](&ps._props,(key_type *)(p_Var12 + 1));
                Property::operator=(this_00,(Property *)(p_Var12 + 2));
              }
              pPVar1 = (pmVar11->_children).
                       super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (__x = (pmVar11->_children).
                         super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  pPVar3 = ps._children.
                           super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                  pPVar2 = ps._children.
                           super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start, __x != pPVar1; __x = __x + 1)
              {
                lVar17 = (long)ps._children.
                               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)ps._children.
                               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                __rhs = &__x->_name;
                lVar16 = 0;
                for (lVar18 = lVar17 / 0x568 >> 2;
                    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pPVar2->_name)._M_dataplus._M_p + lVar16), 0 < lVar18;
                    lVar18 = lVar18 + -1) {
                  _Var5 = ::std::operator==(__lhs,__rhs);
                  if (_Var5) {
                    pPVar15 = (PrimSpec *)((long)&pPVar2->_specifier + lVar16);
                    goto LAB_00177f9a;
                  }
                  _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&pPVar2[1]._name._M_dataplus._M_p + lVar16),
                                            __rhs);
                  if (_Var5) {
                    pPVar15 = (PrimSpec *)((long)&pPVar2[1]._specifier + lVar16);
                    goto LAB_00177f9a;
                  }
                  _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&pPVar2[2]._name._M_dataplus._M_p + lVar16),
                                            __rhs);
                  if (_Var5) {
                    pPVar15 = (PrimSpec *)((long)&pPVar2[2]._specifier + lVar16);
                    goto LAB_00177f9a;
                  }
                  _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&pPVar2[3]._name._M_dataplus._M_p + lVar16),
                                            __rhs);
                  if (_Var5) {
                    pPVar15 = (PrimSpec *)((long)&pPVar2[3]._specifier + lVar16);
                    goto LAB_00177f9a;
                  }
                  lVar16 = lVar16 + 0x15a0;
                }
                lVar17 = (lVar17 - lVar16) / 0x568;
                pPVar19 = (PrimSpec *)((long)&pPVar2->_specifier + lVar16);
                if (lVar17 == 1) {
LAB_00177f86:
                  _Var5 = ::std::operator==(&pPVar19->_name,__rhs);
                  pPVar15 = pPVar19;
                  if (!_Var5) {
                    pPVar15 = pPVar3;
                  }
                }
                else if (lVar17 == 3) {
                  _Var5 = ::std::operator==(__lhs,__rhs);
                  pPVar15 = pPVar19;
                  if (!_Var5) {
                    pPVar19 = (PrimSpec *)((long)&pPVar2[1]._specifier + lVar16);
                    goto LAB_00177f6f;
                  }
                }
                else {
                  pPVar15 = pPVar3;
                  if (lVar17 == 2) {
LAB_00177f6f:
                    _Var5 = ::std::operator==(&pPVar19->_name,__rhs);
                    pPVar15 = pPVar19;
                    if (!_Var5) {
                      pPVar19 = pPVar19 + 1;
                      goto LAB_00177f86;
                    }
                  }
                }
LAB_00177f9a:
                if (pPVar15 ==
                    ps._children.
                    super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
                            (&ps._children,__x);
                }
                else {
                  PrimSpec::operator=(pPVar15,__x);
                }
              }
            }
          }
        }
        ::std::__cxx11::string::_M_dispose();
        pPVar15 = extraout_RDX_00;
      } while( true );
    }
  }
  else if (bVar4 == false) {
    PrimSpec::operator=(dst,src);
    return true;
  }
  if (warn != (string *)0x0) {
    ::std::__cxx11::string::append((char *)warn);
  }
  PrimSpec::operator=(dst,src);
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reset(&(dst->_metas).variants);
  nonstd::optional_lite::
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reset(&(dst->_metas).variantSets);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::clear(&(dst->_variantSets)._M_t);
  return true;
}

Assistant:

bool VariantSelectPrimSpec(
    PrimSpec &dst, const PrimSpec &src,
    const std::map<std::string, std::string> &variant_selection,
    std::string *warn, std::string *err) {
  if (src.metas().variants && src.metas().variantSets) {
    // do variant compsotion
  } else if (src.metas().variants) {
    if (warn) {
      (*warn) +=
          "`variants` are authored, but `variantSets` is not authored.\n";
    }
    dst = src;
    dst.metas().variants.reset();
    dst.metas().variantSets.reset();
    dst.variantSets().clear();
    return true;
  } else if (src.metas().variantSets) {
    if (warn) {
      (*warn) +=
          "`variantSets` are authored, but `variants` is not authored.\n";
    }
    dst = src;
    dst.metas().variants.reset();
    dst.metas().variantSets.reset();
    dst.variantSets().clear();
    // nothing to do.
    return true;
  } else {
    dst = src;
    return true;
  }

  const auto &variantSetMeta = src.metas().variantSets.value();

  const ListEditQual qual = variantSetMeta.first;
  (void)qual;

  dst = src;

  PrimSpec ps = src;  // temp PrimSpec. Init with src.

  // Evaluate from the last element.
  for (int64_t i = int64_t(variantSetMeta.second.size()) - 1; i >= 0; i--) {
    const auto &variantSetName = variantSetMeta.second[size_t(i)];

    // 1. look into `variant_selection`.
    // 2. look into variant setting in this PrimSpec.

    std::string variantName;
    if (variant_selection.count(variantSetName)) {
      variantName = variant_selection.at(variantSetName);
    } else if (dst.current_variant_selection(variantSetName, &variantName)) {
      // ok
    } else {
      continue;
    }

    if (dst.variantSets().count(variantSetName)) {
      const auto &vss = dst.variantSets().at(variantSetName);

      if (vss.variantSet.count(variantName)) {
        const PrimSpec &vs = vss.variantSet.at(variantName);

        DCOUT(fmt::format("variantSet[{}] Select variant: {}", variantSetName,
                          variantName));

        //
        // Promote variant content to PrimSpec.
        //

        // over-like operation
        ps.metas().update_from(vs.metas(), /* override_authored */ true);

        for (const auto &prop : vs.props()) {
          DCOUT("prop: " << prop.first);
          // override existing prop
          ps.props()[prop.first] = prop.second;
        }

        for (const auto &child : vs.children()) {
          // Override if PrimSpec has same name
          // simple linear scan.
          auto it = std::find_if(ps.children().begin(), ps.children().end(),
                                 [&child](const PrimSpec &item) {
                                   return (item.name() == child.name());
                                 });

          if (it != ps.children().end()) {
            (*it) = child;  // replace
          } else {
            ps.children().push_back(child);
          }
        }

        // TODO:
        // - [ ] update `primChildren` and `properties` metadataum if required.
      }
    }
  }

  DCOUT("Variant resolved prim: " << prim::print_primspec(ps));

  // Local properties/metadatum wins against properties/metadataum from Variant
  ps.specifier() = Specifier::Over;
  if (!OverridePrimSpec(dst, ps, warn, err)) {
    PUSH_ERROR_AND_RETURN("Failed to override PrimSpec.");
  }

  dst.metas().variants.reset();
  dst.metas().variantSets.reset();
  dst.variantSets().clear();

  return true;
}